

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O1

compile_errcode __thiscall ConditionStatement::Action(ConditionStatement *this)

{
  SymbolName SVar1;
  int iVar2;
  compile_errcode cVar3;
  Statement *pSVar4;
  int iVar5;
  pointer pcVar6;
  
  pSVar4 = (Statement *)operator_new(0x1e8);
  (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001745d8;
  (pSVar4->m_output_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001744d0;
  (pSVar4->m_output_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001741b8;
  (pSVar4->m_output_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174210;
  (pSVar4->m_input_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174420;
  (pSVar4->m_return_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174478;
  (pSVar4->m_return_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001741b8;
  (pSVar4->m_return_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174210;
  (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174528;
  (pSVar4->m_assign_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001741b8;
  (pSVar4->m_assign_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174210;
  (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p =
       (pointer)&(pSVar4->m_assign_statement).m_identifier_name.field_2;
  iVar2 = 0;
  (pSVar4->m_assign_statement).m_identifier_name._M_string_length = 0;
  (pSVar4->m_assign_statement).m_identifier_name.field_2._M_local_buf[0] = '\0';
  (pSVar4->m_function_call).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174630;
  (pSVar4->m_function_call).m_value_argument_list.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174268;
  (pSVar4->m_function_call).m_value_argument_list.m_expression.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001741b8;
  (pSVar4->m_function_call).m_value_argument_list.m_expression.m_term.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
  (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174688;
  (pSVar4->m_condition_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174580;
  (pSVar4->m_condition_statement).m_condition.m_expression.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001741b8;
  (pSVar4->m_condition_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
  (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p =
       (pointer)&(pSVar4->m_condition_statement).m_bottom_label.field_2;
  (pSVar4->m_condition_statement).m_bottom_label._M_string_length = 0;
  (pSVar4->m_condition_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
  (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001746e0;
  (pSVar4->m_while_loop_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174580;
  (pSVar4->m_while_loop_statement).m_condition.m_expression.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001741b8;
  (pSVar4->m_while_loop_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
  (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p =
       (pointer)&(pSVar4->m_while_loop_statement).m_top_label.field_2;
  (pSVar4->m_while_loop_statement).m_top_label._M_string_length = 0;
  (pSVar4->m_while_loop_statement).m_top_label.field_2._M_local_buf[0] = '\0';
  (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p =
       (pointer)&(pSVar4->m_while_loop_statement).m_bottom_label.field_2;
  (pSVar4->m_while_loop_statement).m_bottom_label._M_string_length = 0;
  (pSVar4->m_while_loop_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
  (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174738;
  (pSVar4->m_switch_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001741b8;
  (pSVar4->m_switch_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174210;
  (pSVar4->m_switch_statement).m_switch_table.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174790;
  (pSVar4->m_switch_statement).m_switch_table.m_switch_child_statement.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001747e8;
  (pSVar4->m_switch_statement).m_default.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00174840;
  (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p =
       (pointer)&(pSVar4->m_switch_statement).m_bottom_label.field_2;
  (pSVar4->m_switch_statement).m_bottom_label._M_string_length = 0;
  (pSVar4->m_switch_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
  this->m_statement_ptr = pSVar4;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(iVar2) {
    case 0:
      iVar2 = 1;
      if (SVar1 == IF_SYM) goto switchD_00131e25_default;
      iVar5 = 5;
      iVar2 = 0;
      break;
    case 1:
      iVar2 = 2;
      if (SVar1 == L_CIRCLE_BRACKET_SYM) goto switchD_00131e25_default;
      iVar5 = 5;
      iVar2 = 1;
      break;
    case 2:
      cVar3 = Condition::Action(&this->m_condition);
      if (cVar3 == 0) {
        Condition::LogOutput(&this->m_condition);
        iVar2 = 3;
        goto switchD_00131e25_default;
      }
      iVar5 = 5;
      iVar2 = 2;
      break;
    case 3:
      iVar2 = 4;
      if (SVar1 == R_CIRCLE_BRACKET_SYM) goto switchD_00131e25_default;
      iVar5 = 5;
      iVar2 = 3;
      break;
    case 4:
      iVar2 = (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[2])();
      if (iVar2 == 0) {
        (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[1])();
        iVar2 = 5;
        goto switchD_00131e25_default;
      }
      iVar5 = 5;
      iVar2 = 4;
      break;
    case 5:
      iVar5 = 6;
      break;
    default:
switchD_00131e25_default:
      iVar5 = 0;
      if ((iVar2 != 3) && (iVar5 = 0, iVar2 != 5)) {
        SymbolQueue::NextSymbol(handle_correct_queue);
      }
    }
    if (iVar5 != 0) {
      if (iVar5 == 5) {
        pSVar4 = this->m_statement_ptr;
        if (pSVar4 == (Statement *)0x0) {
          return -1;
        }
        (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001745d8;
        (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00174738;
        pcVar6 = (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &(pSVar4->m_switch_statement).m_bottom_label.field_2) {
          operator_delete(pcVar6);
        }
        (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001746e0;
        pcVar6 = (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &(pSVar4->m_while_loop_statement).m_bottom_label.field_2) {
          operator_delete(pcVar6);
        }
        pcVar6 = (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &(pSVar4->m_while_loop_statement).m_top_label.field_2) {
          operator_delete(pcVar6);
        }
        (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00174688;
        pcVar6 = (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &(pSVar4->m_condition_statement).m_bottom_label.field_2) {
          operator_delete(pcVar6);
        }
        (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00174528;
        pcVar6 = (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p;
        cVar3 = -1;
      }
      else {
        pSVar4 = this->m_statement_ptr;
        if (pSVar4 == (Statement *)0x0) {
          return 0;
        }
        (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001745d8;
        (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00174738;
        pcVar6 = (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &(pSVar4->m_switch_statement).m_bottom_label.field_2) {
          operator_delete(pcVar6);
        }
        (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001746e0;
        pcVar6 = (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &(pSVar4->m_while_loop_statement).m_bottom_label.field_2) {
          operator_delete(pcVar6);
        }
        pcVar6 = (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &(pSVar4->m_while_loop_statement).m_top_label.field_2) {
          operator_delete(pcVar6);
        }
        (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00174688;
        pcVar6 = (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &(pSVar4->m_condition_statement).m_bottom_label.field_2) {
          operator_delete(pcVar6);
        }
        (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00174528;
        pcVar6 = (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p;
        cVar3 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar6 != &(pSVar4->m_assign_statement).m_identifier_name.field_2) {
        operator_delete(pcVar6);
      }
      operator_delete(pSVar4);
      return cVar3;
    }
  } while( true );
}

Assistant:

compile_errcode ConditionStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    m_statement_ptr = new Statement;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == IF_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 2: {
                if ((ret = m_condition.Action()) == COMPILE_OK) {
                    m_condition.LogOutput();
                    state = 3;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 4: {
                if ((ret = m_statement_ptr->Action()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    state = 5;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 5: goto CORRECT_IF;
        }
        if (state != 3 && state != 5)
            handle_correct_queue->NextSymbol();
    }
    CORRECT_IF:
        delete(m_statement_ptr);
        return COMPILE_OK;
    ERROR_IF:
        delete(m_statement_ptr);
        return NOT_MATCH;
}